

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.h
# Opt level: O3

void __thiscall CanonicSampler::markov_step(CanonicSampler *this)

{
  FixedDegreeProposer *this_00;
  double dVar1;
  double dVar2;
  uint uVar3;
  Network *network;
  Random *pRVar4;
  Histogram<unsigned_int> *pHVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  GeneratedProposal proposal;
  GeneratedProposal local_50;
  
  network = (this->super_UniformSampler).network;
  uVar6 = network->total_triangles;
  this_00 = &(this->super_UniformSampler).proposer;
  FixedDegreeProposer::generate_proposal(&local_50,this_00,network);
  FixedDegreeProposer::propose(this_00,(this->super_UniformSampler).network,&local_50);
  pRVar4 = (this->super_UniformSampler).super_Sampler.rng;
  uVar3 = ((this->super_UniformSampler).network)->total_triangles;
  dVar7 = std::
          generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    (&pRVar4->generator);
  dVar1 = (pRVar4->uniform)._M_param._M_a;
  dVar2 = (pRVar4->uniform)._M_param._M_b;
  uVar6 = uVar6 / 3;
  dVar8 = exp((double)(uVar3 / 3 - uVar6) * this->beta);
  if (dVar8 < (dVar2 - dVar1) * dVar7 + dVar1) {
    FixedDegreeProposer::rollback(this_00,(this->super_UniformSampler).network,&local_50);
  }
  pHVar5 = (this->super_UniformSampler).super_Sampler.histogram;
  (*pHVar5->_vptr_Histogram[3])(pHVar5,(ulong)uVar6);
  return;
}

Assistant:

void markov_step() {
        unsigned int old_triangles = network.get_triangles();

        GeneratedProposal proposal = proposer.generate_proposal(network);
        proposer.propose(network, proposal);

        unsigned int new_triangles = network.get_triangles();

        bool was_accepted = true;
        // if rejected
        if (rng.R() > exp(beta*(new_triangles - old_triangles))) {
            proposer.rollback(network, proposal);
            was_accepted = false;
        }

        histogram.add(old_triangles);
    }